

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_test.cc
# Opt level: O2

void __thiscall
writer_test_should_write_utc_timestamp_field_Test::writer_test_should_write_utc_timestamp_field_Test
          (writer_test_should_write_utc_timestamp_field_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001d7ae8;
  return;
}

Assistant:

TEST(writer_test, should_write_utc_timestamp_field)
{
    using Field = Fixpp::Field<Fixpp::Tag::SendingTime>;
    Field field;

    std::tm tm{};
    tm.tm_year = 117;
    tm.tm_mon = 4;
    tm.tm_mday = 16;
    tm.tm_hour = 13;
    tm.tm_min = 45;
    tm.tm_sec = 30;

    auto ts = mkgmtime(&tm);
    field.set(ts);

    std::ostringstream oss;
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "52=20170516-13:45:30|");
}